

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint8_t * svb_insert_scalar_d1_init
                    (uint8_t *keyPtr,uint8_t *dataPtr,size_t dataSize,uint32_t count,uint32_t prev,
                    uint32_t new_key,uint32_t *position)

{
  sbyte sVar1;
  uint8_t *__src;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint val;
  char cVar14;
  uint uVar15;
  int iVar16;
  uint32_t new_key_local;
  uint8_t *dataPtr_local;
  byte *local_58;
  uint32_t local_50;
  uint32_t local_4c;
  byte *local_48;
  uint8_t *local_40;
  byte *local_38;
  
  local_48 = (byte *)CONCAT44(local_48._4_4_,count);
  new_key_local = new_key;
  dataPtr_local = dataPtr;
  local_50 = new_key;
  if (count == 0) {
    *position = 0;
    local_40 = svb_encode_scalar_d1_init(&new_key_local,keyPtr,dataPtr,1,prev);
  }
  else {
    uVar11 = (uint)*keyPtr;
    local_40 = dataPtr + dataSize;
    uVar6 = 0;
    uVar7 = 0;
    local_58 = keyPtr;
    local_38 = dataPtr;
    while( true ) {
      __src = dataPtr_local;
      cVar14 = (char)uVar7;
      if ((uint32_t)local_48 == uVar6) break;
      if (cVar14 == '\b') {
        uVar7 = 0;
        uVar11 = (uint)local_58[1];
        local_58 = local_58 + 1;
      }
      uVar15 = uVar11 >> (uVar7 & 0x1f);
      local_4c = uVar6;
      uVar6 = _decode_data(&dataPtr_local,(byte)uVar15 & 3);
      puVar2 = local_40;
      uVar12 = uVar6 + prev;
      bVar3 = (byte)uVar7;
      if (local_50 <= uVar12) {
        sVar1 = (bVar3 < 0x21) * (' ' - bVar3);
        uVar11 = (-1 << (uVar7 & 0x1f) & uVar11) << 2 | (uVar11 << sVar1) >> sVar1;
        bVar4 = (byte)(uVar11 >> 8) & 3;
        local_48 = local_58 + 1;
        for (pbVar9 = local_48; pbVar9 < local_38; pbVar9 = pbVar9 + 1) {
          bVar10 = *pbVar9 << 2 | bVar4;
          bVar4 = *pbVar9 >> 6;
          *pbVar9 = bVar10;
        }
        val = new_key_local - prev;
        iVar8 = 1;
        iVar16 = iVar8;
        if (0xff < val) {
          if (val < 0x10000) {
            iVar16 = 2;
          }
          else {
            iVar16 = 4 - (uint)(val < 0x1000000);
          }
        }
        uVar13 = uVar12 - new_key_local;
        if (0xff < uVar13) {
          if (uVar13 < 0x10000) {
            iVar8 = 2;
          }
          else {
            iVar8 = 4 - (uint)(uVar13 < 0x1000000);
          }
        }
        iVar16 = iVar16 + (~uVar15 | 0xfffffffc);
        uVar15 = iVar16 + iVar8;
        dataPtr_local = __src;
        if (uVar15 != 0 && SCARRY4(iVar16,iVar8) == (int)uVar15 < 0) {
          memmove(__src + uVar15,__src,(long)local_40 - (long)__src);
        }
        uVar5 = _encode_data(val,&dataPtr_local);
        *local_58 = uVar5 << (uVar7 & 0x1f) | (byte)uVar11;
        uVar7 = 0;
        pbVar9 = local_48;
        if ((byte)(bVar3 + 2) != 8) {
          pbVar9 = local_58;
          uVar7 = (uint)(byte)(bVar3 + 2);
        }
        uVar5 = _encode_data(uVar12 - new_key_local,&dataPtr_local);
        *pbVar9 = uVar5 << (uVar7 & 0x1f) | ~(byte)(3 << (uVar7 & 0x1f)) & *pbVar9;
        *position = local_4c;
        return puVar2 + (int)uVar15;
      }
      uVar7 = (uint)(byte)(bVar3 + 2);
      uVar6 = local_4c + 1;
      prev = uVar12;
    }
    if (cVar14 == '\b') {
      uVar7 = 0;
    }
    bVar3 = _encode_data(local_50 - prev,&dataPtr_local);
    local_58[cVar14 == '\b'] = bVar3 << (uVar7 & 0x1f) | ~(byte)(3 << (uVar7 & 0x1f)) & (byte)uVar11
    ;
    local_40 = local_40 + (ulong)bVar3 + 1;
    *position = (uint32_t)local_48;
  }
  return local_40;
}

Assistant:

uint8_t *svb_insert_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   size_t dataSize, uint32_t count,
                                   uint32_t prev, uint32_t new_key,
                                   uint32_t *position) {
  if (count == 0) {
    *position = 0;
    return svb_encode_scalar_d1_init(&new_key, keyPtr, dataPtr, 1, prev);
  }

  uint8_t shift = 0;
  uint32_t key = *keyPtr;
  uint8_t *dataPtrBegin = dataPtr;

  for (uint32_t c = 0; c < count; c++) {
    uint8_t *dataPtrPrev = dataPtr;

    if (shift == 8) {
      shift = 0;
      key = *(++keyPtr);
    }

    uint8_t current_key_code = (key >> shift) & 0x3;
    uint32_t current_key = prev + _decode_data(&dataPtr, current_key_code);
    if (current_key >= new_key) {
      // rewind to the insertion position
      dataPtr = dataPtrPrev;

      // shift keys 2 bits "to the right"
      uint32_t mask_hi = key & (~0u << shift);
      uint32_t mask_lo = key & ((1 << shift) - 1);
      key = (mask_hi << 2) | mask_lo;
      uint32_t carry_bits, prev_carry_bits = (key & (3 << 8)) >> 8;

      for (uint8_t *p = keyPtr + 1; p < dataPtrBegin; p++) {
        carry_bits = (*p & (3 << 6)) >> 6;
        *p <<= 2;
        *p |= prev_carry_bits;
        prev_carry_bits = carry_bits;
      }

      // shift values n bytes "to the right", then insert the new key
      // and the updated delta of the next key
      int gap = _encoded_length(new_key - prev) +
                _encoded_length(current_key - new_key) - (current_key_code + 1);
      assert(gap >= 0);
      if (gap > 0)
        memmove(dataPtr + gap, dataPtr, dataSize - (dataPtr - dataPtrBegin));

      // first insert the new key
      uint8_t code = _encode_data(new_key - prev, &dataPtr);
      *keyPtr = (uint8_t)(key | (code << shift));

      // then update the current key
      shift += 2;
      if (shift == 8) {
        shift = 0;
        keyPtr++;
      }
      code = _encode_data(current_key - new_key, &dataPtr);
      *keyPtr &= ~(3 << shift);
      *keyPtr |= (code << shift);

      *position = c;
      return dataPtrBegin + dataSize + gap;
    }

    prev = current_key;
    shift += 2;
  }

  // append the new key at the end
  if (shift == 8) {
    shift = 0;
    keyPtr++;
  }

  uint8_t code = _encode_data(new_key - prev, &dataPtr);
  key &= ~(3 << shift);
  key |= code << shift;
  *keyPtr = (uint8_t)(key); // write last key (no increment needed)

  *position = count;
  return dataPtrBegin + dataSize + code + 1;
}